

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQInteger *nparams,SQInteger *nfreevars)

{
  SQObjectType SVar1;
  SQClosure *pSVar2;
  SQFunctionProto *pSVar3;
  SQNativeClosure *c;
  SQObjectPtr *pSVar4;
  
  if (idx < 0) {
    pSVar4 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar4 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar4->super_SQObject)._type;
  pSVar2 = (pSVar4->super_SQObject)._unVal.pClosure;
  if (SVar1 == OT_NATIVECLOSURE) {
    *nparams = (SQInteger)pSVar2->_env;
    pSVar4 = pSVar2->_defaultparams;
  }
  else {
    if (SVar1 != OT_CLOSURE) {
      sq_throwerror(v,"the object is not a closure");
      return -1;
    }
    pSVar3 = pSVar2->_function;
    *nparams = pSVar3->_nparameters;
    pSVar4 = (SQObjectPtr *)pSVar3->_noutervalues;
  }
  *nfreevars = (SQInteger)pSVar4;
  return 0;
}

Assistant:

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQInteger *nparams,SQInteger *nfreevars)
{
    SQObject o = stack_get(v, idx);
    if(sq_type(o) == OT_CLOSURE) {
        SQClosure *c = _closure(o);
        SQFunctionProto *proto = c->_function;
        *nparams = proto->_nparameters;
        *nfreevars = proto->_noutervalues;
        return SQ_OK;
    }
    else if(sq_type(o) == OT_NATIVECLOSURE)
    {
        SQNativeClosure *c = _nativeclosure(o);
        *nparams = c->_nparamscheck;
        *nfreevars = (SQInteger)c->_noutervalues;
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a closure"));
}